

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method___gc(lua_State *L)

{
  undefined8 *puVar1;
  char *pcVar2;
  SBufExt *pSVar3;
  ulong uVar4;
  
  pSVar3 = buffer_tobuf(L);
  if (((pSVar3->L).ptr64 & 6) == 0) {
    puVar1 = (undefined8 *)(L->glref).ptr64;
    pcVar2 = pSVar3->b;
    uVar4 = (ulong)(uint)(*(int *)&pSVar3->e - (int)pcVar2);
    puVar1[2] = puVar1[2] - uVar4;
    (*(code *)*puVar1)(puVar1[1],pcVar2,uVar4,0);
  }
  (pSVar3->L).ptr64 = (uint64_t)((long)&(L->nextgc).gcptr64 + 1);
  pSVar3->b = (char *)0x0;
  pSVar3->w = (char *)0x0;
  pSVar3->e = (char *)0x0;
  pSVar3->field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)0x0;
  pSVar3->r = (char *)0x0;
  return 0;
}

Assistant:

LJLIB_CF(buffer_method___gc)
{
  SBufExt *sbx = buffer_tobuf(L);
  lj_bufx_free(L, sbx);
  return 0;
}